

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O3

Wrench * iDynTree::transformWrenchEfficient<iDynTree::Wrench>(Transform *op1,Wrench *op2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Wrench *ret;
  Wrench *in_RDI;
  double dVar16;
  double dVar17;
  double dVar18;
  
  (in_RDI->super_SpatialForceVector)._vptr_SpatialForceVector =
       (_func_int **)&PTR__SpatialForceVector_0015ec30;
  dVar6 = (op1->rot).super_Matrix3x3.m_data[0];
  dVar7 = (op1->rot).super_Matrix3x3.m_data[1];
  dVar8 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          linearVec3.super_Vector3.m_data[0];
  dVar9 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          linearVec3.super_Vector3.m_data[1];
  dVar1 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          linearVec3.super_Vector3.m_data[2];
  dVar10 = (op1->rot).super_Matrix3x3.m_data[3];
  dVar11 = (op1->rot).super_Matrix3x3.m_data[4];
  dVar2 = (op1->rot).super_Matrix3x3.m_data[5];
  dVar18 = dVar1 * dVar2 + dVar9 * dVar11 + dVar8 * dVar10;
  dVar12 = (op1->rot).super_Matrix3x3.m_data[6];
  dVar13 = (op1->rot).super_Matrix3x3.m_data[7];
  dVar3 = (op1->rot).super_Matrix3x3.m_data[8];
  dVar4 = (op1->pos).super_Vector3.m_data[0];
  dVar5 = (op1->rot).super_Matrix3x3.m_data[2];
  dVar16 = dVar1 * dVar3 + dVar9 * dVar13 + dVar8 * dVar12;
  dVar17 = dVar1 * dVar5 + dVar7 * dVar9 + dVar6 * dVar8;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[0] = dVar17;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[1] = dVar18;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[2] = dVar16;
  dVar8 = (op1->pos).super_Vector3.m_data[1];
  dVar9 = (op1->pos).super_Vector3.m_data[2];
  dVar14 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
           angularVec3.super_Vector3.m_data[0];
  dVar15 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
           angularVec3.super_Vector3.m_data[1];
  dVar1 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          angularVec3.super_Vector3.m_data[2];
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[0] =
       dVar1 * dVar5 + dVar7 * dVar15 + dVar6 * dVar14 + (dVar8 * dVar16 - dVar18 * dVar9);
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[1] =
       dVar1 * dVar2 + dVar11 * dVar15 + dVar10 * dVar14 + (dVar9 * dVar17 - dVar16 * dVar4);
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[2] =
       dVar13 * dVar15 + dVar12 * dVar14 + dVar3 * dVar1 + (dVar4 * dVar18 - dVar17 * dVar8);
  return in_RDI;
}

Assistant:

spatialForceType transformWrenchEfficient(const Transform& op1, const spatialForceType& op2)
    {
        spatialForceType ret;

        Eigen::Map<const Eigen::Vector3d> p(op1.getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(op1.getRotation().data());

        toEigen(ret.getLinearVec3()) = R*toEigen(op2.getLinearVec3());
        toEigen(ret.getAngularVec3())  = R*toEigen(op2.getAngularVec3()) + p.cross(toEigen(ret.getLinearVec3()));

        return ret;
    }